

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.c
# Opt level: O1

size_t bitset_extract_setbits_avx512_uint16
                 (uint64_t *array,size_t length,uint16_t *vout,size_t capacity,uint16_t base)

{
  undefined1 (*pauVar1) [64];
  short sVar2;
  ulong uVar3;
  undefined1 (*pauVar4) [64];
  undefined1 (*pauVar5) [64];
  ulong uVar6;
  long lVar7;
  int iVar8;
  uint64_t uVar9;
  undefined1 (*pauVar10) [64];
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  
  pauVar1 = (undefined1 (*) [64])(vout + capacity);
  if ((long)capacity < 0x41 || length == 0) {
    uVar6 = 0;
    pauVar5 = (undefined1 (*) [64])vout;
  }
  else {
    auVar12 = vmovdqa64_avx512f((undefined1  [64])vbmi2_table);
    uVar6 = 0;
    pauVar10 = (undefined1 (*) [64])vout;
    do {
      lVar7 = POPCOUNT(array[uVar6]);
      auVar13 = vpcompressb_avx512_vbmi2(auVar12,array[uVar6]);
      auVar14 = vpbroadcastw_avx512bw();
      auVar15 = vpmovsxbw_avx512bw(auVar13._0_32_);
      auVar11 = vextracti64x4_avx512f(auVar13,1);
      auVar13 = vpmovsxbw_avx512bw(auVar11);
      auVar15 = vpaddw_avx512bw(auVar14,auVar15);
      auVar14 = vpaddw_avx512bw(auVar14,auVar13);
      auVar13 = vmovdqu64_avx512f(auVar15);
      *pauVar10 = auVar13;
      auVar13 = vmovdqu64_avx512f(auVar14);
      pauVar10[1] = auVar13;
      pauVar5 = (undefined1 (*) [64])(*pauVar10 + lVar7 * 2);
      uVar6 = uVar6 + 1;
      if (length <= uVar6) break;
      pauVar4 = pauVar10 + 2;
      pauVar10 = pauVar5;
    } while ((undefined1 (*) [64])(*pauVar4 + lVar7 * 2) < pauVar1);
  }
  if ((uVar6 < length) && (pauVar5 < pauVar1)) {
    iVar8 = (uint)base + (int)uVar6 * 0x40;
    do {
      uVar9 = array[uVar6];
      if (uVar9 != 0) {
        do {
          sVar2 = 0;
          for (uVar3 = uVar9; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x8000000000000000) {
            sVar2 = sVar2 + 1;
          }
          *(short *)*pauVar5 = sVar2 + (short)iVar8;
          pauVar5 = (undefined1 (*) [64])(*pauVar5 + 2);
          uVar9 = uVar9 - 1 & uVar9;
        } while ((uVar9 != 0) && (pauVar5 < pauVar1));
      }
      uVar6 = uVar6 + 1;
    } while ((uVar6 < length) && (iVar8 = iVar8 + 0x40, pauVar5 < pauVar1));
  }
  return (long)pauVar5 - (long)vout >> 1;
}

Assistant:

size_t bitset_extract_setbits_avx512_uint16(const uint64_t *array,
                                            size_t length, uint16_t *vout,
                                            size_t capacity, uint16_t base) {
    uint16_t *out = (uint16_t *)vout;
    uint16_t *initout = out;
    uint16_t *safeout = vout + capacity;

    __m512i base_v = _mm512_set1_epi16(base);
    __m512i index_table = _mm512_loadu_si512(vbmi2_table);
    size_t i = 0;

    for (; (i < length) && ((out + 64) < safeout); i++) {
        uint64_t v = array[i];
        __m512i vec = _mm512_maskz_compress_epi8(v, index_table);

        uint8_t advance = (uint8_t)roaring_hamming(v);

        __m512i vbase =
            _mm512_add_epi16(base_v, _mm512_set1_epi16((short)(i * 64)));
        __m512i r1 = _mm512_cvtepi8_epi16(_mm512_extracti32x8_epi32(vec, 0));
        __m512i r2 = _mm512_cvtepi8_epi16(_mm512_extracti32x8_epi32(vec, 1));

        r1 = _mm512_add_epi16(r1, vbase);
        r2 = _mm512_add_epi16(r2, vbase);

        _mm512_storeu_si512((__m512i *)out, r1);
        _mm512_storeu_si512((__m512i *)(out + 32), r2);
        out += advance;
    }

    base += i * 64;

    for (; (i < length) && (out < safeout); ++i) {
        uint64_t w = array[i];
        while ((w != 0) && (out < safeout)) {
            int r =
                roaring_trailing_zeroes(w);  // on x64, should compile to TZCNT
            uint32_t val = r + base;
            memcpy(out, &val, sizeof(uint16_t));
            out++;
            w &= (w - 1);
        }
        base += 64;
    }

    return out - initout;
}